

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_tetgen_volume(REF_GRID ref_grid,char *project,char *options)

{
  REF_NODE ref_node_00;
  REF_CELL pRVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  REF_STATUS RVar5;
  void *__ptr;
  double dVar6;
  REF_LONG ref_private_status_reis_bi_28;
  REF_LONG ref_private_status_reis_ai_28;
  REF_LONG ref_private_status_reis_bi_27;
  REF_LONG ref_private_status_reis_ai_27;
  REF_LONG ref_private_status_reis_bi_26;
  REF_LONG ref_private_status_reis_ai_26;
  REF_LONG ref_private_status_reis_bi_25;
  REF_LONG ref_private_status_reis_ai_25;
  REF_LONG ref_private_status_reis_bi_24;
  REF_LONG ref_private_status_reis_ai_24;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_23;
  REF_LONG ref_private_status_reis_ai_23;
  REF_LONG ref_private_status_reis_bi_22;
  REF_LONG ref_private_status_reis_ai_22;
  REF_LONG ref_private_status_reis_bi_21;
  REF_LONG ref_private_status_reis_ai_21;
  REF_LONG ref_private_status_reis_bi_20;
  REF_LONG ref_private_status_reis_ai_20;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_INT ref_malloc_init_i;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reib_bi;
  REF_LONG ref_private_status_reib_ai;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL *position;
  REF_BOOL problem;
  REF_BOOL delete_temp_files;
  int system_status;
  REF_INT nodes [27];
  int local_824;
  REF_INT new_cell;
  REF_INT cell;
  REF_DBL dist;
  REF_DBL xyz [3];
  int local_7f8;
  int local_7f4;
  REF_INT new_node;
  REF_INT item;
  REF_INT nnode_surface;
  REF_INT node;
  REF_INT id;
  REF_INT node_per;
  REF_INT ntet;
  REF_INT ntri;
  REF_GLOB global;
  REF_INT mark;
  REF_INT attr;
  REF_INT ndim;
  REF_INT nnode;
  FILE *file;
  char command [1024];
  char filename [896];
  REF_CELL ref_cell;
  REF_NODE ref_node;
  char *options_local;
  char *project_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  printf("%d surface nodes %d triangles\n",(ulong)(uint)ref_node_00->n,
         (ulong)(uint)ref_grid->cell[3]->n);
  snprintf(command + 0x3f8,0x380,"%s-tetgen.poly",project);
  ref_grid_local._4_4_ = ref_export_by_extension(ref_grid,command + 0x3f8);
  if (ref_grid_local._4_4_ == 0) {
    printf("  The \'S1000\' argument can be added to tetgen options\n");
    printf("    to cap inserted nodes at 1000 and reduce run time.\n");
    printf("  The \'q20/10\' arguments (radius-edge-ratio/dihedral-angle)\n");
    printf("    can be increased for faster initial volume refinement.\n");
    printf("  The \'O7/7\' arguments (optimization iterations/operation)\n");
    printf("    can be decreased for faster mesh optimization.\n");
    printf("  See \'ref bootstrap -h\' for \'--mesher-options\' description\n");
    printf("    and the TetGen user manual for details.\n");
    if (options == (char *)0x0) {
      snprintf((char *)&file,0x400,"tetgen -pMYq20/10O7/7zVT1e-12 %s < /dev/null > %s-tetgen.txt",
               command + 0x3f8,project);
    }
    else {
      snprintf((char *)&file,0x400,"tetgen %s %s < /dev/null > %s-tetgen.txt",options,
               command + 0x3f8,project);
    }
    printf("%s\n",&file);
    fflush(_stdout);
    uVar3 = sleep(2);
    if ((ulong)uVar3 == 0) {
      iVar4 = system((char *)&file);
      uVar3 = sleep(2);
      if ((ulong)uVar3 == 0) {
        if ((long)iVar4 == 0) {
          snprintf(command + 0x3f8,0x380,"%s-tetgen.1.node",project);
          _ndim = fopen(command + 0x3f8,"r");
          if (_ndim == (FILE *)0x0) {
            printf("unable to open %s\n",command + 0x3f8);
          }
          if (_ndim == (FILE *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x89b,"ref_geom_tetgen_volume","unable to open file");
            ref_grid_local._4_4_ = 2;
          }
          else {
            iVar4 = __isoc99_fscanf(_ndim,"%d",&attr);
            if ((long)iVar4 == 1) {
              iVar4 = __isoc99_fscanf(_ndim,"%d",&mark);
              if ((long)iVar4 == 1) {
                if ((long)mark == 3) {
                  iVar4 = __isoc99_fscanf(_ndim,"%d",(long)&global + 4);
                  if ((long)iVar4 == 1) {
                    if ((long)global._4_4_ == 0) {
                      iVar4 = __isoc99_fscanf(_ndim,"%d",&global);
                      if ((long)iVar4 == 1) {
                        if ((long)(int)global == 0) {
                          new_node = ref_node_00->n;
                          printf("%d interior nodes\n",(ulong)(uint)(attr - new_node));
                          for (item = 0; item < new_node; item = item + 1) {
                            iVar4 = __isoc99_fscanf(_ndim,"%d",&local_7f4);
                            if ((long)iVar4 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8ab,"ref_geom_tetgen_volume","node item",1,(long)iVar4);
                              return 1;
                            }
                            if (item != local_7f4) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8ac,"ref_geom_tetgen_volume","node index");
                              return 1;
                            }
                            iVar4 = __isoc99_fscanf(_ndim,"%lf",&dist);
                            if (iVar4 != 1) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8ad,"ref_geom_tetgen_volume","x");
                              return 1;
                            }
                            iVar4 = __isoc99_fscanf(_ndim,"%lf",xyz);
                            if (iVar4 != 1) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8ae,"ref_geom_tetgen_volume","y");
                              return 1;
                            }
                            iVar4 = __isoc99_fscanf(_ndim,"%lf",xyz + 1);
                            if (iVar4 != 1) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8af,"ref_geom_tetgen_volume","z");
                              return 1;
                            }
                            dVar6 = sqrt((xyz[1] - ref_node_00->real[item * 0xf + 2]) *
                                         (xyz[1] - ref_node_00->real[item * 0xf + 2]) +
                                         (dist - ref_node_00->real[item * 0xf]) *
                                         (dist - ref_node_00->real[item * 0xf]) +
                                         (xyz[0] - ref_node_00->real[item * 0xf + 1]) *
                                         (xyz[0] - ref_node_00->real[item * 0xf + 1]));
                            if (1e-12 < dVar6) {
                              printf("node %d off by %e\n",dVar6,(ulong)(uint)item);
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8b8,"ref_geom_tetgen_volume","tetgen moved node");
                              return 1;
                            }
                          }
                          for (item = new_node; item < attr; item = item + 1) {
                            iVar4 = __isoc99_fscanf(_ndim,"%d",&local_7f4);
                            if ((long)iVar4 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8be,"ref_geom_tetgen_volume","node item",1,(long)iVar4);
                              return 1;
                            }
                            if ((long)item != (long)local_7f4) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8bf,"ref_geom_tetgen_volume","file node index",(long)item,
                                     (long)local_7f4);
                              return 1;
                            }
                            uVar3 = ref_node_next_global(ref_node_00,(REF_GLOB *)&ntet);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8c0,"ref_geom_tetgen_volume",(ulong)uVar3,"next global");
                              return uVar3;
                            }
                            if (item != _ntet) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8c1,"ref_geom_tetgen_volume","global node index",(long)item,
                                     _ntet);
                              return 1;
                            }
                            uVar3 = ref_node_add(ref_node_00,_ntet,&local_7f8);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8c2,"ref_geom_tetgen_volume",(ulong)uVar3,"new_node");
                              return uVar3;
                            }
                            if (item != local_7f8) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8c3,"ref_geom_tetgen_volume","node index");
                              return 1;
                            }
                            iVar4 = __isoc99_fscanf(_ndim,"%lf",&dist);
                            if (iVar4 != 1) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8c4,"ref_geom_tetgen_volume","x");
                              return 1;
                            }
                            iVar4 = __isoc99_fscanf(_ndim,"%lf",xyz);
                            if (iVar4 != 1) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8c5,"ref_geom_tetgen_volume","y");
                              return 1;
                            }
                            iVar4 = __isoc99_fscanf(_ndim,"%lf",xyz + 1);
                            if (iVar4 != 1) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8c6,"ref_geom_tetgen_volume","z");
                              return 1;
                            }
                            ref_node_00->real[local_7f8 * 0xf] = dist;
                            ref_node_00->real[local_7f8 * 0xf + 1] = xyz[0];
                            ref_node_00->real[local_7f8 * 0xf + 2] = xyz[1];
                          }
                          fclose(_ndim);
                          bVar2 = false;
                          snprintf(command + 0x3f8,0x380,"%s-tetgen.1.face",project);
                          _ndim = fopen(command + 0x3f8,"r");
                          if (_ndim == (FILE *)0x0) {
                            printf("unable to open %s\n",command + 0x3f8);
                          }
                          if (_ndim == (FILE *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                   ,0x8d3,"ref_geom_tetgen_volume","unable to open file");
                            ref_grid_local._4_4_ = 2;
                          }
                          else {
                            iVar4 = __isoc99_fscanf(_ndim,"%d",&node_per);
                            if ((long)iVar4 == 1) {
                              iVar4 = __isoc99_fscanf(_ndim,"%d",&global);
                              if ((long)iVar4 == 1) {
                                if ((long)(int)global == 1) {
                                  pRVar1 = ref_grid->cell[3];
                                  if (pRVar1->max < 0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                           ,0x8d9,"ref_geom_tetgen_volume",
                                           "malloc position of REF_INT negative");
                                    ref_grid_local._4_4_ = 1;
                                  }
                                  else {
                                    __ptr = malloc((long)pRVar1->max << 2);
                                    if (__ptr == (void *)0x0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                             ,0x8d9,"ref_geom_tetgen_volume",
                                             "malloc position of REF_INT NULL");
                                      ref_grid_local._4_4_ = 2;
                                    }
                                    else {
                                      for (ref_private_status_reis_ai_16._4_4_ = 0;
                                          ref_private_status_reis_ai_16._4_4_ < pRVar1->max;
                                          ref_private_status_reis_ai_16._4_4_ =
                                               ref_private_status_reis_ai_16._4_4_ + 1) {
                                        *(undefined4 *)
                                         ((long)__ptr +
                                         (long)ref_private_status_reis_ai_16._4_4_ * 4) = 0xffffffff
                                        ;
                                      }
                                      for (local_824 = 0; local_824 < node_per;
                                          local_824 = local_824 + 1) {
                                        iVar4 = __isoc99_fscanf(_ndim,"%d",&local_7f4);
                                        if ((long)iVar4 != 1) {
                                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                 ,0x8db,"ref_geom_tetgen_volume","tri item",1,
                                                 (long)iVar4);
                                          return 1;
                                        }
                                        if (local_824 != local_7f4) {
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                 ,0x8dc,"ref_geom_tetgen_volume","tri index");
                                          return 1;
                                        }
                                        for (item = 0; item < 3; item = item + 1) {
                                          iVar4 = __isoc99_fscanf(_ndim,"%d",
                                                                  &delete_temp_files + item);
                                          if (iVar4 != 1) {
                                            printf("%s: %d: %s: %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x8de,"ref_geom_tetgen_volume","tri");
                                            return 1;
                                          }
                                        }
                                        if ((int)global == 1) {
                                          iVar4 = __isoc99_fscanf(_ndim,"%d",&nnode_surface);
                                          if ((long)iVar4 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x8df,"ref_geom_tetgen_volume","tri mark id",1,
                                                  (long)iVar4);
                                            return 1;
                                          }
                                        }
                                        RVar5 = ref_cell_with(pRVar1,&delete_temp_files,nodes + 0x1a
                                                             );
                                        if (RVar5 == 0) {
                                          *(int *)((long)__ptr + (long)nodes[0x1a] * 4) = local_824;
                                        }
                                        else {
                                          bVar2 = true;
                                          ref_node_location(ref_node_00,delete_temp_files);
                                          ref_node_location(ref_node_00,system_status);
                                          ref_node_location(ref_node_00,nodes[0]);
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                 ,0x8e7,"ref_geom_tetgen_volume",
                                                 "tetgen face tri not found in ref_grid");
                                        }
                                      }
                                      for (local_824 = 0; local_824 < pRVar1->max;
                                          local_824 = local_824 + 1) {
                                        RVar5 = ref_cell_nodes(pRVar1,local_824,&delete_temp_files);
                                        if ((RVar5 == 0) &&
                                           (*(int *)((long)__ptr + (long)local_824 * 4) == -1)) {
                                          bVar2 = true;
                                          ref_node_location(ref_node_00,delete_temp_files);
                                          ref_node_location(ref_node_00,system_status);
                                          ref_node_location(ref_node_00,nodes[0]);
                                          printf("face id %d\n",(ulong)(uint)nodes[1]);
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                 ,0x8f1,"ref_geom_tetgen_volume",
                                                 "ref_grid tri not found in tetgen face");
                                        }
                                      }
                                      if (__ptr != (void *)0x0) {
                                        free(__ptr);
                                      }
                                      if (bVar2) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                               ,0x8f5,"ref_geom_tetgen_volume",
                                               "problem detected in tetgen triangles");
                                        ref_grid_local._4_4_ = 1;
                                      }
                                      else {
                                        fclose(_ndim);
                                        snprintf(command + 0x3f8,0x380,"%s-tetgen.1.ele",project);
                                        _ndim = fopen(command + 0x3f8,"r");
                                        if (_ndim == (FILE *)0x0) {
                                          printf("unable to open %s\n",command + 0x3f8);
                                        }
                                        if (_ndim == (FILE *)0x0) {
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                 ,0x8fc,"ref_geom_tetgen_volume",
                                                 "unable to open file");
                                          ref_grid_local._4_4_ = 2;
                                        }
                                        else {
                                          iVar4 = __isoc99_fscanf(_ndim,"%d",&id);
                                          if ((long)iVar4 == 1) {
                                            iVar4 = __isoc99_fscanf(_ndim,"%d",&node);
                                            if ((long)iVar4 == 1) {
                                              if ((long)node == 4) {
                                                iVar4 = __isoc99_fscanf(_ndim,"%d",&global);
                                                if ((long)iVar4 == 1) {
                                                  if ((long)(int)global == 0) {
                                                    pRVar1 = ref_grid->cell[8];
                                                    for (local_824 = 0; local_824 < id;
                                                        local_824 = local_824 + 1) {
                                                      iVar4 = __isoc99_fscanf(_ndim,"%d",&local_7f4)
                                                      ;
                                                      if ((long)iVar4 != 1) {
                                                        printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x906,"ref_geom_tetgen_volume","tet item",1,
                                                  (long)iVar4);
                                                  return 1;
                                                  }
                                                  if (local_824 != local_7f4) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x907,"ref_geom_tetgen_volume","tet index");
                                                  return 1;
                                                  }
                                                  for (item = 0; item < 4; item = item + 1) {
                                                    iVar4 = __isoc99_fscanf(_ndim,"%d",
                                                                            &delete_temp_files +
                                                                            item);
                                                    if (iVar4 != 1) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x909,"ref_geom_tetgen_volume","tet");
                                                  return 1;
                                                  }
                                                  }
                                                  uVar3 = ref_cell_add(pRVar1,&delete_temp_files,
                                                                       nodes + 0x1a);
                                                  if (uVar3 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x90a,"ref_geom_tetgen_volume",(ulong)uVar3,
                                                  "new tet");
                                                  return uVar3;
                                                  }
                                                  if (local_824 != nodes[0x1a]) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x90b,"ref_geom_tetgen_volume","tet index");
                                                  return 1;
                                                  }
                                                  }
                                                  fclose(_ndim);
                                                  ref_grid->surf = 0;
                                                  snprintf(command + 0x3f8,0x380,"%s-tetgen.1.edge",
                                                           project);
                                                  iVar4 = remove(command + 0x3f8);
                                                  if ((long)iVar4 == 0) {
                                                    snprintf(command + 0x3f8,0x380,
                                                             "%s-tetgen.1.face",project);
                                                    iVar4 = remove(command + 0x3f8);
                                                    if ((long)iVar4 == 0) {
                                                      snprintf(command + 0x3f8,0x380,
                                                               "%s-tetgen.1.node",project);
                                                      iVar4 = remove(command + 0x3f8);
                                                      if ((long)iVar4 == 0) {
                                                        snprintf(command + 0x3f8,0x380,
                                                                 "%s-tetgen.1.ele",project);
                                                        iVar4 = remove(command + 0x3f8);
                                                        if ((long)iVar4 == 0) {
                                                          snprintf(command + 0x3f8,0x380,
                                                                   "%s-tetgen.poly",project);
                                                          iVar4 = remove(command + 0x3f8);
                                                          if ((long)iVar4 == 0) {
                                                            ref_grid_local._4_4_ = 0;
                                                          }
                                                          else {
                                                            printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x91c,"ref_geom_tetgen_volume",
                                                  "rm .poly tetgen input file",0,(long)iVar4);
                                                  ref_grid_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x91a,"ref_geom_tetgen_volume",
                                                  "rm .1.ele tetgen output file",0,(long)iVar4);
                                                  ref_grid_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x918,"ref_geom_tetgen_volume",
                                                  "rm .1.node tetgen output file",0,(long)iVar4);
                                                  ref_grid_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x916,"ref_geom_tetgen_volume",
                                                  "rm .1.face tetgen output file",0,(long)iVar4);
                                                  ref_grid_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x914,"ref_geom_tetgen_volume",
                                                  "rm .1.edge tetgen output file",0,(long)iVar4);
                                                  ref_grid_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x902,"ref_geom_tetgen_volume","ele have mark",0,
                                                  (long)(int)global);
                                                  ref_grid_local._4_4_ = 1;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x901,"ref_geom_tetgen_volume","ele header mark",
                                                  1,(long)iVar4);
                                                  ref_grid_local._4_4_ = 1;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x900,"ref_geom_tetgen_volume","expected tets",4,
                                                  (long)node);
                                                ref_grid_local._4_4_ = 1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x8ff,"ref_geom_tetgen_volume",
                                                  "ele header node_per",1,(long)iVar4);
                                              ref_grid_local._4_4_ = 1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0x8fe,"ref_geom_tetgen_volume","ele header ntet",
                                                  1,(long)iVar4);
                                            ref_grid_local._4_4_ = 1;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                         ,0x8d6,"ref_geom_tetgen_volume","face have mark",1,
                                         (long)(int)global);
                                  ref_grid_local._4_4_ = 1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                       ,0x8d5,"ref_geom_tetgen_volume","face header mark",1,
                                       (long)iVar4);
                                ref_grid_local._4_4_ = 1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x8d4,"ref_geom_tetgen_volume","face header ntri",1,
                                     (long)iVar4);
                              ref_grid_local._4_4_ = 1;
                            }
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0x8a3,"ref_geom_tetgen_volume","nodes have mark",0,
                                 (long)(int)global);
                          ref_grid_local._4_4_ = 1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x8a2,"ref_geom_tetgen_volume","node header mark",1,(long)iVar4);
                        ref_grid_local._4_4_ = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x8a1,"ref_geom_tetgen_volume","nodes have attribute 3D",0,
                             (long)global._4_4_);
                      ref_grid_local._4_4_ = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0x8a0,"ref_geom_tetgen_volume","node header attr",1,(long)iVar4);
                    ref_grid_local._4_4_ = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x89f,"ref_geom_tetgen_volume","not 3D",3,(long)mark);
                  ref_grid_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x89e,"ref_geom_tetgen_volume","node header ndim",1,(long)iVar4);
                ref_grid_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x89d,"ref_geom_tetgen_volume","node header nnode",1,(long)iVar4);
              ref_grid_local._4_4_ = 1;
            }
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x896,"ref_geom_tetgen_volume","tetgen failed",0,(long)iVar4);
          printf("tec360 ref_geom_test_tetgen_geom.tec\n");
          ref_geom_tec(ref_grid,"ref_geom_test_tetgen_geom.tec");
          printf("tec360 ref_geom_test_tetgen_surf.tec\n");
          ref_export_tec_surf(ref_grid,"ref_geom_test_tetgen_surf.tec");
          ref_grid_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x890,"ref_geom_tetgen_volume","sleep failed",0,(ulong)uVar3);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x88e,
             "ref_geom_tetgen_volume","sleep failed",0,(ulong)uVar3);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x879,
           "ref_geom_tetgen_volume",(ulong)ref_grid_local._4_4_,"poly");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tetgen_volume(REF_GRID ref_grid,
                                          const char *project,
                                          const char *options) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  char filename[896];
  char command[1024];
  FILE *file;
  REF_INT nnode, ndim, attr, mark;
  REF_GLOB global;
  REF_INT ntri, ntet, node_per, id;
  REF_INT node, nnode_surface, item, new_node;
  REF_DBL xyz[3], dist;
  REF_INT cell, new_cell, nodes[REF_CELL_MAX_SIZE_PER];
  int system_status;
  REF_BOOL delete_temp_files = REF_TRUE;
  REF_BOOL problem;
  REF_BOOL *position;

  printf("%d surface nodes %d triangles\n", ref_node_n(ref_node),
         ref_cell_n(ref_grid_tri(ref_grid)));

  snprintf(filename, 896, "%s-tetgen.poly", project);
  RSS(ref_export_by_extension(ref_grid, filename), "poly");

  printf("  The 'S1000' argument can be added to tetgen options\n");
  printf("    to cap inserted nodes at 1000 and reduce run time.\n");
  printf("  The 'q20/10' arguments (radius-edge-ratio/dihedral-angle)\n");
  printf("    can be increased for faster initial volume refinement.\n");
  printf("  The 'O7/7' arguments (optimization iterations/operation)\n");
  printf("    can be decreased for faster mesh optimization.\n");
  printf("  See 'ref bootstrap -h' for '--mesher-options' description\n");
  printf("    and the TetGen user manual for details.\n");

  if (NULL == options) {
    snprintf(command, 1024,
             "tetgen -pMYq20/10O7/7zVT1e-12 %s < /dev/null > %s-tetgen.txt",
             filename, project);
  } else {
    snprintf(command, 1024, "tetgen %s %s < /dev/null > %s-tetgen.txt", options,
             filename, project);
  }
  printf("%s\n", command);
  fflush(stdout);
  REIS(0, sleep(2), "sleep failed");
  system_status = system(command);
  REIS(0, sleep(2), "sleep failed");
  REIB(0, system_status, "tetgen failed", {
    printf("tec360 ref_geom_test_tetgen_geom.tec\n");
    ref_geom_tec(ref_grid, "ref_geom_test_tetgen_geom.tec");
    printf("tec360 ref_geom_test_tetgen_surf.tec\n");
    ref_export_tec_surf(ref_grid, "ref_geom_test_tetgen_surf.tec");
  });

  snprintf(filename, 896, "%s-tetgen.1.node", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &nnode), "node header nnode");
  REIS(1, fscanf(file, "%d", &ndim), "node header ndim");
  REIS(3, ndim, "not 3D");
  REIS(1, fscanf(file, "%d", &attr), "node header attr");
  REIS(0, attr, "nodes have attribute 3D");
  REIS(1, fscanf(file, "%d", &mark), "node header mark");
  REIS(0, mark, "nodes have mark");

  /* verify surface nodes */
  nnode_surface = ref_node_n(ref_node);

  printf("%d interior nodes\n", nnode - nnode_surface);

  for (node = 0; node < nnode_surface; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    RES(node, item, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    dist = sqrt((xyz[0] - ref_node_xyz(ref_node, 0, node)) *
                    (xyz[0] - ref_node_xyz(ref_node, 0, node)) +
                (xyz[1] - ref_node_xyz(ref_node, 1, node)) *
                    (xyz[1] - ref_node_xyz(ref_node, 1, node)) +
                (xyz[2] - ref_node_xyz(ref_node, 2, node)) *
                    (xyz[2] - ref_node_xyz(ref_node, 2, node)));
    if (dist > 1.0e-12) {
      printf("node %d off by %e\n", node, dist);
      THROW("tetgen moved node");
    }
  }

  /* interior nodes */
  for (node = nnode_surface; node < nnode; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    REIS(node, item, "file node index");
    RSS(ref_node_next_global(ref_node, &global), "next global");
    REIS(node, global, "global node index");
    RSS(ref_node_add(ref_node, global, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }

  fclose(file);

  /* check .1.face when paranoid, but tetgen -z should not mess with them */
  problem = REF_FALSE;
  snprintf(filename, 896, "%s-tetgen.1.face", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");
  REIS(1, fscanf(file, "%d", &ntri), "face header ntri");
  REIS(1, fscanf(file, "%d", &mark), "face header mark");
  REIS(1, mark, "face have mark");

  ref_cell = ref_grid_tri(ref_grid);
  ref_malloc_init(position, ref_cell_max(ref_cell), REF_INT, REF_EMPTY);
  for (cell = 0; cell < ntri; cell++) {
    REIS(1, fscanf(file, "%d", &item), "tri item");
    RES(cell, item, "tri index");
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    if (1 == mark) REIS(1, fscanf(file, "%d", &id), "tri mark id");
    if (REF_SUCCESS == ref_cell_with(ref_cell, nodes, &new_cell)) {
      position[new_cell] = cell;
    } else {
      problem = REF_TRUE;
      ref_node_location(ref_node, nodes[0]);
      ref_node_location(ref_node, nodes[1]);
      ref_node_location(ref_node, nodes[2]);
      REF_WHERE("tetgen face tri not found in ref_grid");
    }
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (REF_EMPTY == position[cell]) {
      problem = REF_TRUE;
      ref_node_location(ref_node, nodes[0]);
      ref_node_location(ref_node, nodes[1]);
      ref_node_location(ref_node, nodes[2]);
      printf("face id %d\n", nodes[3]);
      REF_WHERE("ref_grid tri not found in tetgen face");
    }
  }
  ref_free(position);
  RAS(!problem, "problem detected in tetgen triangles");

  fclose(file);

  snprintf(filename, 896, "%s-tetgen.1.ele", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &ntet), "ele header ntet");
  REIS(1, fscanf(file, "%d", &node_per), "ele header node_per");
  REIS(4, node_per, "expected tets");
  REIS(1, fscanf(file, "%d", &mark), "ele header mark");
  REIS(0, mark, "ele have mark");

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    REIS(1, fscanf(file, "%d", &item), "tet item");
    RES(cell, item, "tet index");
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }

  fclose(file);

  ref_grid_surf(ref_grid) = REF_FALSE;

  if (delete_temp_files) {
    snprintf(filename, 896, "%s-tetgen.1.edge", project);
    REIS(0, remove(filename), "rm .1.edge tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.face", project);
    REIS(0, remove(filename), "rm .1.face tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.node", project);
    REIS(0, remove(filename), "rm .1.node tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.ele", project);
    REIS(0, remove(filename), "rm .1.ele tetgen output file");
    snprintf(filename, 896, "%s-tetgen.poly", project);
    REIS(0, remove(filename), "rm .poly tetgen input file");
  }

  return REF_SUCCESS;
}